

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O1

ValueCallback * __thiscall
SNMPAgent::addOpaqueHandler
          (SNMPAgent *this,char *oid,uint8_t *value,size_t data_len,bool isSettable,
          bool overwritePrefix)

{
  SortableOIDType *pSVar1;
  ValueCallback *pVVar2;
  
  if (value != (uint8_t *)0x0) {
    pSVar1 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (pSVar1 != (SortableOIDType *)0x0) {
      pVVar2 = (ValueCallback *)operator_new(0x28);
      pVVar2->OID = pSVar1;
      pVVar2->type = OPAQUE;
      pVVar2->isSettable = false;
      pVVar2->setOccurred = false;
      pVVar2->_vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_001a4ab0;
      pVVar2[1]._vptr_ValueCallback = (_func_int **)value;
      *(int *)&pVVar2[1].OID = (int)data_len;
      pVVar2 = addHandler(this,pVVar2,isSettable);
      return pVVar2;
    }
  }
  return (ValueCallback *)0x0;
}

Assistant:

ValueCallback* SNMPAgent::addOpaqueHandler(const char *oid, uint8_t* value, size_t data_len, bool isSettable, bool overwritePrefix){
    if(!value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new OpaqueCallback(oidType, value, data_len), isSettable);
}